

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  CURLcode local_34;
  CURLcode code;
  _Bool *protocol_done_local;
  _Bool *asyncp_local;
  connectdata **in_connect_local;
  SessionHandle *data_local;
  
  *asyncp = false;
  local_34 = create_conn(data,in_connect,asyncp);
  if (local_34 == CURLE_OK) {
    if (((*in_connect)->send_pipe->size == 0) && ((*in_connect)->recv_pipe->size == 0)) {
      if ((*asyncp & 1U) == 0) {
        local_34 = Curl_setup_conn(*in_connect,protocol_done);
      }
    }
    else {
      *protocol_done = true;
    }
  }
  if (local_34 == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = (connectdata *)0x0;
  }
  else if ((local_34 != CURLE_OK) && (*in_connect != (connectdata *)0x0)) {
    Curl_disconnect(*in_connect,false);
    *in_connect = (connectdata *)0x0;
  }
  return local_34;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode code;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  code = create_conn(data, in_connect, asyncp);

  if(CURLE_OK == code) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      code = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(code == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return code;
  }

  if(code && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return code;
}